

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O3

void duckdb::ApproxTopKOperation::Combine<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>
               (ApproxTopKState *aggr_source,ApproxTopKState *aggr_target,
               AggregateInputData *aggr_input)

{
  pointer puVar1;
  _Hash_node_base *p_Var2;
  ApproxTopKValue *pAVar3;
  ulong __code;
  pointer prVar4;
  pointer prVar5;
  pointer puVar6;
  pointer puVar7;
  InternalApproxTopKState *pIVar8;
  InternalApproxTopKState *this;
  pointer prVar9;
  __node_base_ptr p_Var10;
  NotImplementedException *this_00;
  pointer prVar11;
  idx_t increment;
  _Hash_node_base *increment_00;
  long lVar12;
  reference_wrapper<duckdb::ApproxTopKValue> *source_entry;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  idx_t local_68;
  string local_50;
  
  if (aggr_source->state != (InternalApproxTopKState *)0x0) {
    pIVar8 = ApproxTopKState::GetState(aggr_source);
    this = ApproxTopKState::GetState(aggr_target);
    prVar11 = (pIVar8->values).
              super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((pIVar8->values).
        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        ._M_impl.super__Vector_impl_data._M_start != prVar11) {
      p_Var2 = (_Hash_node_base *)(prVar11[-1]._M_data)->count;
      prVar9 = (this->values).
               super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      prVar11 = (this->values).
                super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (prVar9 == prVar11) {
        InternalApproxTopKState::Initialize(this,pIVar8->k);
        prVar9 = (this->values).
                 super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        prVar11 = (this->values).
                  super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_68 = 0;
      }
      else {
        if (pIVar8->k != this->k) {
          this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Approx Top K - cannot combine approx_top_K with different k values. K values must be the same for all entries within the same group"
                     ,"");
          NotImplementedException::NotImplementedException(this_00,&local_50);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_68 = (prVar11[-1]._M_data)->count;
      }
      if (prVar11 != prVar9) {
        uVar13 = 0;
        do {
          pAVar3 = prVar9[uVar13]._M_data;
          __code = (pAVar3->str_val).hash;
          p_Var10 = ::std::
                    _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_before_node
                              (&(pIVar8->lookup_map)._M_h,
                               __code % (pIVar8->lookup_map)._M_h._M_bucket_count,&pAVar3->str_val,
                               __code);
          increment_00 = p_Var2;
          if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
            increment_00 = (p_Var10->_M_nxt[4]._M_nxt)->_M_nxt;
          }
          if (increment_00 != (_Hash_node_base *)0x0) {
            InternalApproxTopKState::IncrementCount(this,pAVar3,(idx_t)increment_00);
          }
          uVar13 = uVar13 + 1;
          prVar9 = (this->values).
                   super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)(this->values).
                                        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                                        .
                                        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)prVar9 >>
                                 3));
      }
      prVar11 = (pIVar8->values).
                super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      prVar9 = (pIVar8->values).
               super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (prVar11 != prVar9) {
        do {
          pAVar3 = prVar11->_M_data;
          uVar13 = (pAVar3->str_val).hash;
          p_Var10 = ::std::
                    _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_before_node
                              (&(this->lookup_map)._M_h,
                               uVar13 % (this->lookup_map)._M_h._M_bucket_count,&pAVar3->str_val,
                               uVar13);
          if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
            increment = pAVar3->count + local_68;
            prVar4 = (this->values).
                     super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            prVar5 = (this->values).
                     super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar12 = (long)prVar5 - (long)prVar4;
            if (this->capacity <= (ulong)(lVar12 >> 3)) {
              if (prVar4 == prVar5) {
                uVar13 = 0;
              }
              else {
                uVar13 = **(ulong **)((long)prVar4 + lVar12 + -8);
              }
              bVar15 = increment < uVar13;
              increment = increment - uVar13;
              if (bVar15 || increment == 0) goto LAB_00df8dbb;
            }
            InternalApproxTopKState::InsertOrReplaceEntry
                      (this,&pAVar3->str_val,aggr_input,increment);
          }
LAB_00df8dbb:
          prVar11 = prVar11 + 1;
        } while (prVar11 != prVar9);
      }
      puVar6 = (pIVar8->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = (long)(pIVar8->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar6;
      if (lVar12 != 0) {
        lVar12 = lVar12 >> 3;
        puVar7 = (this->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          puVar1 = puVar7 + lVar14;
          *puVar1 = *puVar1 + puVar6[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
      }
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &aggr_source, STATE &aggr_target, AggregateInputData &aggr_input) {
		if (!aggr_source.state) {
			// source state is empty
			return;
		}
		auto &source = aggr_source.GetState();
		auto &target = aggr_target.GetState();
		if (source.values.empty()) {
			// source is empty
			return;
		}
		source.Verify();
		auto min_source = source.values.back().get().count;
		idx_t min_target;
		if (target.values.empty()) {
			min_target = 0;
			target.Initialize(source.k);
		} else {
			if (source.k != target.k) {
				throw NotImplementedException("Approx Top K - cannot combine approx_top_K with different k values. "
				                              "K values must be the same for all entries within the same group");
			}
			min_target = target.values.back().get().count;
		}
		// for all entries in target
		// check if they are tracked in source
		//     if they do - add the tracked count
		//     if they do not - add the minimum count
		for (idx_t target_idx = 0; target_idx < target.values.size(); target_idx++) {
			auto &val = target.values[target_idx].get();
			auto source_entry = source.lookup_map.find(val.str_val);
			idx_t increment = min_source;
			if (source_entry != source.lookup_map.end()) {
				increment = source_entry->second.get().count;
			}
			if (increment == 0) {
				continue;
			}
			target.IncrementCount(val, increment);
		}
		// now for each entry in source, if it is not tracked by the target, at the target minimum
		for (auto &source_entry : source.values) {
			auto &source_val = source_entry.get();
			auto target_entry = target.lookup_map.find(source_val.str_val);
			if (target_entry != target.lookup_map.end()) {
				// already tracked - no need to add anything
				continue;
			}
			auto new_count = source_val.count + min_target;
			idx_t increment;
			if (target.values.size() >= target.capacity) {
				idx_t current_min = target.values.empty() ? 0 : target.values.back().get().count;
				D_ASSERT(target.values.size() == target.capacity);
				// target already has capacity values
				// check if we should insert this entry
				if (new_count <= current_min) {
					// if we do not we can skip this entry
					continue;
				}
				increment = new_count - current_min;
			} else {
				// target does not have capacity entries yet
				// just add this entry with the full count
				increment = new_count;
			}
			target.InsertOrReplaceEntry(source_val.str_val, aggr_input, increment);
		}
		// copy over the filter
		D_ASSERT(source.filter.size() == target.filter.size());
		for (idx_t filter_idx = 0; filter_idx < source.filter.size(); filter_idx++) {
			target.filter[filter_idx] += source.filter[filter_idx];
		}
		target.Verify();
	}